

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async.c++
# Opt level: O0

String * __thiscall kj::TaskSet::trace(String *__return_storage_ptr__,TaskSet *this)

{
  Task *pTVar1;
  char *in_RCX;
  String local_78;
  Own<kj::TaskSet::Task,_kj::_::PromiseDisposer> *local_60;
  Own<kj::TaskSet::Task,_kj::_::PromiseDisposer> *task;
  Own<kj::TaskSet::Task,_kj::_::PromiseDisposer> *local_48;
  Own<kj::TaskSet::Task,_kj::_::PromiseDisposer> *_task381;
  Maybe<kj::Own<kj::TaskSet::Task,_kj::_::PromiseDisposer>_> *ptr;
  Vector<kj::String> traces;
  TaskSet *this_local;
  
  traces.builder.disposer = (ArrayDisposer *)this;
  Vector<kj::String>::Vector((Vector<kj::String> *)&ptr);
  _task381 = &(this->tasks).ptr;
  while( true ) {
    local_48 = kj::_::readMaybe<kj::TaskSet::Task,kj::_::PromiseDisposer>
                         ((Maybe<kj::Own<kj::TaskSet::Task,_kj::_::PromiseDisposer>_> *)_task381);
    if (local_48 == (Own<kj::TaskSet::Task,_kj::_::PromiseDisposer> *)0x0) break;
    local_60 = local_48;
    pTVar1 = Own<kj::TaskSet::Task,_kj::_::PromiseDisposer>::operator->(local_48);
    Task::trace(&local_78,pTVar1);
    Vector<kj::String>::add<kj::String>((Vector<kj::String> *)&ptr,&local_78);
    String::~String(&local_78);
    pTVar1 = Own<kj::TaskSet::Task,_kj::_::PromiseDisposer>::operator->(local_60);
    _task381 = &(pTVar1->next).ptr;
  }
  strArray<kj::Vector<kj::String>&>
            (__return_storage_ptr__,(kj *)&ptr,(Vector<kj::String> *)0xa6d9de,in_RCX);
  Vector<kj::String>::~Vector((Vector<kj::String> *)&ptr);
  return __return_storage_ptr__;
}

Assistant:

kj::String TaskSet::trace() {
  kj::Vector<kj::String> traces;

  Maybe<OwnTask>* ptr = &tasks;
  for (;;) {
    KJ_IF_SOME(task, *ptr) {
      traces.add(task->trace());
      ptr = &task->next;
    } else {
      break;
    }
  }